

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster_config.cxx
# Opt level: O2

bufptr __thiscall cornerstone::cluster_config::serialize(cluster_config *this)

{
  pointer puVar1;
  size_t sVar2;
  _Head_base<0UL,_cornerstone::buffer_*,_false> extraout_RDX;
  unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *item;
  pointer puVar3;
  ulong *in_RSI;
  ulong *puVar4;
  size_t size;
  bufptr bVar5;
  vector<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>,_std::allocator<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>_>_>
  srv_buffs;
  bufptr buf;
  
  srv_buffs.
  super__Vector_base<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>,_std::allocator<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  srv_buffs.
  super__Vector_base<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>,_std::allocator<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  srv_buffs.
  super__Vector_base<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>,_std::allocator<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  size = 0x14;
  puVar4 = in_RSI + 2;
  while (puVar4 = (ulong *)*puVar4, puVar4 != in_RSI + 2) {
    srv_config::serialize((srv_config *)&buf);
    sVar2 = buffer::size(buf._M_t.
                         super___uniq_ptr_impl<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>
                         ._M_t.
                         super__Tuple_impl<0UL,_cornerstone::buffer_*,_void_(*)(cornerstone::buffer_*)>
                         .super__Head_base<0UL,_cornerstone::buffer_*,_false>._M_head_impl);
    std::
    vector<std::unique_ptr<cornerstone::buffer,void(*)(cornerstone::buffer*)>,std::allocator<std::unique_ptr<cornerstone::buffer,void(*)(cornerstone::buffer*)>>>
    ::emplace_back<std::unique_ptr<cornerstone::buffer,void(*)(cornerstone::buffer*)>>
              ((vector<std::unique_ptr<cornerstone::buffer,void(*)(cornerstone::buffer*)>,std::allocator<std::unique_ptr<cornerstone::buffer,void(*)(cornerstone::buffer*)>>>
                *)&srv_buffs,
               (unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *)&buf);
    size = size + sVar2;
    std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>::~unique_ptr
              ((unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *)&buf);
  }
  buffer::alloc((buffer *)this,size);
  buffer::put((buffer *)this->prev_log_idx_,*in_RSI);
  buffer::put((buffer *)this->prev_log_idx_,in_RSI[1]);
  buffer::put((buffer *)this->prev_log_idx_,(int32)in_RSI[4]);
  puVar1 = srv_buffs.
           super__Vector_base<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>,_std::allocator<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar3 = srv_buffs.
                super__Vector_base<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>,_std::allocator<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    buffer::put((buffer *)this->prev_log_idx_,
                (puVar3->_M_t).
                super___uniq_ptr_impl<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>._M_t.
                super__Tuple_impl<0UL,_cornerstone::buffer_*,_void_(*)(cornerstone::buffer_*)>.
                super__Head_base<0UL,_cornerstone::buffer_*,_false>._M_head_impl);
  }
  buffer::pos((buffer *)this->prev_log_idx_,0);
  std::
  vector<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>,_std::allocator<std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>_>_>
  ::~vector(&srv_buffs);
  bVar5._M_t.super___uniq_ptr_impl<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>._M_t.
  super__Tuple_impl<0UL,_cornerstone::buffer_*,_void_(*)(cornerstone::buffer_*)>.
  super__Head_base<0UL,_cornerstone::buffer_*,_false>._M_head_impl = extraout_RDX._M_head_impl;
  bVar5._M_t.super___uniq_ptr_impl<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>._M_t.
  super__Tuple_impl<0UL,_cornerstone::buffer_*,_void_(*)(cornerstone::buffer_*)>.
  super__Tuple_impl<1UL,_void_(*)(cornerstone::buffer_*)>.
  super__Head_base<1UL,_void_(*)(cornerstone::buffer_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(cornerstone::buffer_*),_false>)
       (_Head_base<1UL,_void_(*)(cornerstone::buffer_*),_false>)this;
  return (bufptr)bVar5._M_t.
                 super___uniq_ptr_impl<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>._M_t.
                 super__Tuple_impl<0UL,_cornerstone::buffer_*,_void_(*)(cornerstone::buffer_*)>;
}

Assistant:

bufptr cluster_config::serialize()
{
    size_t sz = 2 * sz_ulong + sz_int;
    std::vector<bufptr> srv_buffs;
    for (cluster_config::const_srv_itor it = servers_.begin(); it != servers_.end(); ++it)
    {
        bufptr buf = (*it)->serialize();
        sz += buf->size();
        srv_buffs.emplace_back(std::move(buf));
    }

    bufptr result = buffer::alloc(sz);
    result->put(log_idx_);
    result->put(prev_log_idx_);
    result->put((int32)servers_.size());
    for (auto& item : srv_buffs)
    {
        result->put(*item);
    }

    result->pos(0);
    return result;
}